

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test5::verifyXFBData
          (GPUShaderFP64Test5 *this,uchar *data_ptr,_test_case *test_case)

{
  double dVar1;
  _swizzle_type type;
  float fVar2;
  double dVar3;
  _variable_type _Var4;
  _variable_type _Var5;
  uint uVar6;
  uint uVar7;
  TestError *this_00;
  bool bVar8;
  uint uVar9;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type type_03;
  _variable_type type_04;
  _variable_type type_05;
  _variable_type type_06;
  _variable_type type_07;
  ulong uVar10;
  char *pcVar11;
  GPUShaderFP64Test5 *this_01;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  string local_208;
  string local_1e8;
  uint swizzle_order [4];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  _Var4 = Utils::getBaseVariableType(test_case->dst_type);
  _Var5 = Utils::getBaseVariableType(test_case->src_type);
  uVar6 = Utils::getNumberOfComponentsForVariableType(test_case->dst_type);
  this_01 = (GPUShaderFP64Test5 *)(ulong)test_case->src_type;
  uVar7 = Utils::getNumberOfComponentsForVariableType(test_case->src_type);
  swizzle_order[0] = 0;
  swizzle_order[1] = 0;
  swizzle_order[2] = 0;
  swizzle_order[3] = 0;
  uVar9 = test_case->src_type - VARIABLE_TYPE_DMAT2;
  if ((0x19 < uVar9) || (bVar13 = true, (0x3fe01ffU >> (uVar9 & 0x1f) & 1) == 0)) {
    type = this->m_swizzle_matrix[uVar6 - 1][uVar7 - 1];
    getSwizzleTypeProperties(this_01,type,(string *)0x0,(uint *)0x0,swizzle_order);
    bVar13 = type == SWIZZLE_TYPE_NONE;
  }
  bVar8 = true;
  lVar12 = 0;
  do {
    if (lVar12 == 5) {
      return bVar8;
    }
    for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      uVar7 = (uint)uVar10;
      if (!bVar13) {
        uVar7 = (int)((uVar10 & 0xffffffff) / (ulong)uVar6) * uVar7 + swizzle_order[uVar10];
      }
      if (_Var4 == VARIABLE_TYPE_BOOL) {
LAB_009e6853:
        fVar14 = (float)uVar7 + this->m_base_values[lVar12];
        fVar15 = (float)(int)fVar14;
        if (fVar14 != 0.0) {
          fVar15 = 1.4013e-45;
        }
        if (NAN(fVar14)) {
          fVar15 = 1.4013e-45;
        }
        fVar2 = *(float *)data_ptr;
        if (_Var4 != VARIABLE_TYPE_BOOL) {
          fVar15 = (float)(int)fVar14;
        }
        if (fVar2 != fVar15) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::operator<<((ostream *)local_1a8,
                          "Invalid boolean/integer value obtained when doing an ");
          pcVar11 = "implicit";
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            pcVar11 = "explicit";
          }
          std::operator<<((ostream *)local_1a8,pcVar11);
          std::operator<<((ostream *)local_1a8," cast from GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_1e8,(Utils *)(ulong)test_case->src_type,type_00);
          std::operator<<((ostream *)local_1a8,(string *)&local_1e8);
          std::operator<<((ostream *)local_1a8,"], component index: [");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8,"], value: [");
          std::ostream::_M_insert<double>((double)fVar14);
          std::operator<<((ostream *)local_1a8,"] to GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_208,(Utils *)(ulong)test_case->dst_type,type_01);
          std::operator<<((ostream *)local_1a8,(string *)&local_208);
          std::operator<<((ostream *)local_1a8,"], retrieved value: [");
          std::ostream::operator<<((ostream *)local_1a8,(int)fVar2);
          std::operator<<((ostream *)local_1a8,"], expected value: [");
          std::ostream::operator<<((ostream *)local_1a8,(int)fVar15);
          std::operator<<((ostream *)local_1a8,"], shader used:\n");
          std::operator<<((ostream *)local_1a8,(test_case->shader_body)._M_dataplus._M_p);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          bVar8 = false;
        }
        data_ptr = (uchar *)((long)data_ptr + 4);
      }
      else if (_Var4 == VARIABLE_TYPE_DOUBLE) {
        dVar20 = (double)uVar7 + (double)this->m_base_values[lVar12];
        if (_Var5 == VARIABLE_TYPE_UINT) {
          dVar17 = (double)((long)(double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar20 |
                                          (ulong)(double)(uVar7 + (int)(long)this->m_base_values
                                                                             [lVar12]) &
                                          -(ulong)(dVar20 < 0.0)) & 0xffffffff);
        }
        else if (_Var5 == VARIABLE_TYPE_INT) {
          dVar17 = (double)(int)dVar20;
        }
        else {
          dVar17 = dVar20;
          if ((_Var5 == VARIABLE_TYPE_BOOL) && (dVar17 = 0.0, (int)dVar20 != 0)) {
            dVar17 = 1.0;
          }
        }
        dVar1 = *(double *)data_ptr;
        data_ptr = (uchar *)((long)data_ptr + 8);
        dVar3 = dVar1 - dVar17;
        dVar18 = -dVar3;
        if (-dVar3 <= dVar3) {
          dVar18 = dVar3;
        }
        if (9.999999747378752e-06 < dVar18) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::operator<<((ostream *)local_1a8,
                          "Invalid double-precision floating-point value obtained when doing an ");
          pcVar11 = "implicit";
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            pcVar11 = "explicit";
          }
          std::operator<<((ostream *)local_1a8,pcVar11);
          std::operator<<((ostream *)local_1a8," cast from GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_1e8,(Utils *)(ulong)test_case->src_type,type_04);
          std::operator<<((ostream *)local_1a8,(string *)&local_1e8);
          std::operator<<((ostream *)local_1a8,"], component index: [");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8,"], value: [");
          std::ostream::_M_insert<double>(dVar20);
          std::operator<<((ostream *)local_1a8,"] to GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_208,(Utils *)(ulong)test_case->dst_type,type_05);
          std::operator<<((ostream *)local_1a8,(string *)&local_208);
          std::operator<<((ostream *)local_1a8,"], retrieved value: [");
          *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 8)) = 0x10;
          std::ostream::_M_insert<double>(dVar1);
          std::operator<<((ostream *)local_1a8,"], expected value: [");
          *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 8)) = 0x10;
          std::ostream::_M_insert<double>(dVar17);
          std::operator<<((ostream *)local_1a8,"], shader used:\n");
          std::operator<<((ostream *)local_1a8,(test_case->shader_body)._M_dataplus._M_p);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_009e70ee:
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          bVar8 = false;
        }
      }
      else if (_Var4 == VARIABLE_TYPE_FLOAT) {
        fVar15 = (float)uVar7 + this->m_base_values[lVar12];
        if (_Var5 == VARIABLE_TYPE_UINT) {
          fVar14 = (float)((long)fVar15 & 0xffffffff);
        }
        else if (_Var5 == VARIABLE_TYPE_INT) {
          fVar14 = (float)(int)fVar15;
        }
        else {
          fVar14 = fVar15;
          if (_Var5 == VARIABLE_TYPE_BOOL) {
            fVar14 = (float)(-(uint)(fVar15 != 0.0) & 0x3f800000);
          }
        }
        fVar2 = *(float *)data_ptr;
        data_ptr = (uchar *)((long)data_ptr + 4);
        fVar16 = fVar2 - fVar14;
        auVar19._0_4_ = -fVar16;
        auVar19._4_4_ = 0x80000000;
        auVar19._8_4_ = 0x80000000;
        auVar19._12_4_ = 0x80000000;
        if (auVar19._0_4_ <= fVar16) {
          auVar19._0_4_ = fVar16;
        }
        if (1e-05 < auVar19._0_4_) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::operator<<((ostream *)local_1a8,
                          "Invalid single-precision floating-point value obtained when doing an ");
          pcVar11 = "implicit";
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            pcVar11 = "explicit";
          }
          std::operator<<((ostream *)local_1a8,pcVar11);
          std::operator<<((ostream *)local_1a8," cast from GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_1e8,(Utils *)(ulong)test_case->src_type,type_06);
          std::operator<<((ostream *)local_1a8,(string *)&local_1e8);
          std::operator<<((ostream *)local_1a8,"], component index: [");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8,"], value: [");
          std::ostream::operator<<((ostream *)local_1a8,fVar15);
          std::operator<<((ostream *)local_1a8,"] to GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_208,(Utils *)(ulong)test_case->dst_type,type_07);
          std::operator<<((ostream *)local_1a8,(string *)&local_208);
          std::operator<<((ostream *)local_1a8,"], retrieved value: [");
          *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 8)) = 0x10;
          std::ostream::operator<<((ostream *)local_1a8,fVar2);
          std::operator<<((ostream *)local_1a8,"], expected value: [");
          *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 8)) = 0x10;
          std::ostream::operator<<((ostream *)local_1a8,fVar14);
          std::operator<<((ostream *)local_1a8,"], shader used:\n");
          std::operator<<((ostream *)local_1a8,(test_case->shader_body)._M_dataplus._M_p);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_009e70ee;
        }
      }
      else {
        if (_Var4 != VARIABLE_TYPE_UINT) {
          if (_Var4 != VARIABLE_TYPE_INT) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unrecognized variable type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x2001);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          goto LAB_009e6853;
        }
        fVar14 = (float)uVar7 + this->m_base_values[lVar12];
        fVar15 = *(float *)data_ptr;
        data_ptr = (uchar *)((long)data_ptr + 4);
        if (0.0 <= fVar14 && fVar15 != (float)(long)fVar14) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::operator<<((ostream *)local_1a8,
                          "Invalid unsigned integer value obtained when doing an ");
          pcVar11 = "implicit";
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            pcVar11 = "explicit";
          }
          std::operator<<((ostream *)local_1a8,pcVar11);
          std::operator<<((ostream *)local_1a8," cast from GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_1e8,(Utils *)(ulong)test_case->src_type,type_02);
          std::operator<<((ostream *)local_1a8,(string *)&local_1e8);
          std::operator<<((ostream *)local_1a8,"], component index: [");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8,"], value: [");
          std::ostream::_M_insert<double>((double)fVar14);
          std::operator<<((ostream *)local_1a8,"] to GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_208,(Utils *)(ulong)test_case->dst_type,type_03);
          std::operator<<((ostream *)local_1a8,(string *)&local_208);
          std::operator<<((ostream *)local_1a8,"], retrieved value: [");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8,"], expected value: [");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8,"], shader used:\n");
          std::operator<<((ostream *)local_1a8,(test_case->shader_body)._M_dataplus._M_p);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          bVar8 = false;
        }
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

bool GPUShaderFP64Test5::verifyXFBData(const unsigned char* data_ptr, const _test_case& test_case)
{
	const Utils::_variable_type base_dst_type		= Utils::getBaseVariableType(test_case.dst_type);
	const Utils::_variable_type base_src_type		= Utils::getBaseVariableType(test_case.src_type);
	const float					epsilon				= 1e-5f;
	const unsigned int			n_base_values		= sizeof(m_base_values) / sizeof(m_base_values[0]);
	const unsigned int			n_result_components = Utils::getNumberOfComponentsForVariableType(test_case.dst_type);
	const unsigned int			n_src_components	= Utils::getNumberOfComponentsForVariableType(test_case.src_type);
	bool						result				= true;
	_swizzle_type				swizzle_operator	= SWIZZLE_TYPE_NONE;
	unsigned int				swizzle_order[4]	= { 0 };
	const unsigned char*		traveller_ptr		= data_ptr;

	if (!Utils::isMatrixVariableType(test_case.src_type))
	{
		DE_ASSERT(n_result_components >= 1 && n_result_components <= 4);
		DE_ASSERT(n_src_components >= 1 && n_src_components <= 4);

		swizzle_operator = m_swizzle_matrix[n_result_components - 1][n_src_components - 1];

		getSwizzleTypeProperties(swizzle_operator, DE_NULL, /* out_swizzle_string */
								 DE_NULL,					/* out_n_components */
								 swizzle_order);
	}

	for (unsigned int n_base_value = 0; n_base_value < n_base_values; ++n_base_value)
	{
		for (unsigned int n_result_component = 0; n_result_component < n_result_components; ++n_result_component)
		{
			unsigned int n_swizzled_component = n_result_component;

			if (swizzle_operator != SWIZZLE_TYPE_NONE)
			{
				n_swizzled_component =
					(n_result_component / n_result_components) * n_result_component + swizzle_order[n_result_component];
			}

			switch (base_dst_type)
			{
			case Utils::VARIABLE_TYPE_BOOL:
			case Utils::VARIABLE_TYPE_INT:
			{
				double ref_expected_value = (m_base_values[n_base_value]) + static_cast<float>(n_swizzled_component);
				double expected_value	 = ref_expected_value;
				int	result_value		  = *((int*)traveller_ptr);

				if (base_dst_type == Utils::VARIABLE_TYPE_BOOL)
				{
					if (expected_value != 0.0)
					{
						expected_value = 1.0;
					}
				}

				if (result_value != (int)expected_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid boolean/integer value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << result_value << "]"
														  ", expected value: ["
									   << (int)expected_value << "]"
																 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				traveller_ptr += sizeof(int);
				break;
			} /* VARIABLE_TYPE_BOOL or VARIABLE_TYPE_INT cases */

			case Utils::VARIABLE_TYPE_DOUBLE:
			{
				double ref_expected_value = m_base_values[n_base_value] + (double)n_swizzled_component;
				double expected_value	 = ref_expected_value;
				double result_value		  = *((double*)traveller_ptr);

				if (base_src_type == Utils::VARIABLE_TYPE_BOOL)
				{
					expected_value = ((int)expected_value != 0.0) ? 1.0 : 0.0;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_INT)
				{
					expected_value = (int)expected_value;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_UINT)
				{
					// Negative values in base values array when converted to unsigned int will be ZERO
					// Addition operations done inside the shader in such cases will operate on ZERO rather
					// than the negative value being passed.
					// Replicate the sequence of conversion and addition operations done on the
					// shader input, to calculate the expected values in XFB data in the
					// problematic cases.
					if (expected_value < 0)
					{
						expected_value = (unsigned int)m_base_values[n_base_value] + n_swizzled_component;
					}
					expected_value = (unsigned int)expected_value;
				}

				traveller_ptr += sizeof(double);
				if (de::abs(result_value - expected_value) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid double-precision floating-point value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << std::setprecision(16) << result_value << "]"
																				   ", expected value: ["
									   << std::setprecision(16) << expected_value << "]"
																					 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_DOUBLE case */

			case Utils::VARIABLE_TYPE_FLOAT:
			{
				float ref_expected_value = (float)m_base_values[n_base_value] + (float)n_swizzled_component;
				float expected_value	 = ref_expected_value;
				float result_value		 = *((float*)traveller_ptr);

				if (base_src_type == Utils::VARIABLE_TYPE_BOOL)
				{
					expected_value = (expected_value != 0.0f) ? 1.0f : 0.0f;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_INT)
				{
					expected_value = (float)((int)expected_value);
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_UINT)
				{
					expected_value = (float)((unsigned int)expected_value);
				}

				traveller_ptr += sizeof(float);
				if (de::abs(result_value - expected_value) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid single-precision floating-point value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << std::setprecision(16) << result_value << "]"
																				   ", expected value: ["
									   << std::setprecision(16) << expected_value << "]"
																					 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_FLOAT case */

			case Utils::VARIABLE_TYPE_UINT:
			{
				double ref_expected_value = (m_base_values[n_base_value]) + static_cast<float>(n_swizzled_component);
				double expected_value	 = ref_expected_value;
				unsigned int result_value = *((unsigned int*)traveller_ptr);

				traveller_ptr += sizeof(unsigned int);
				if (result_value != (unsigned int)expected_value)
				{
					if (expected_value < 0.0)
					{
						// It is undefined to convert a negative floating-point value to an uint.
						break;
					}

					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid unsigned integer value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << result_value << "]"
														  ", expected value: ["
									   << (unsigned int)expected_value << "]"
																		  ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_UINT case */

			default:
			{
				TCU_FAIL("Unrecognized variable type");
			}
			} /* switch (test_case.dst_type) */
		}	 /* for (all result components) */
	}		  /* for (all base values) */

	return result;
}